

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxVariant.cpp
# Opt level: O2

void __thiscall Jinx::Variant::SetCollection(Variant *this,CollectionPtr *value)

{
  Destroy(this);
  this->m_type = Collection;
  (this->field_1).m_number = 0.0;
  (this->field_1).m_string._M_string_length = 0;
  std::
  __shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ::operator=((__shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
               *)&(this->field_1).m_string,
              &value->
               super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
             );
  return;
}

Assistant:

inline_t void Variant::SetCollection(const CollectionPtr & value)
	{
		Destroy();
		if (!value)
		{
			m_type = ValueType::Null;
			m_integer = 0;
		}
		m_type = ValueType::Collection;
		new(&m_collection) CollectionPtr();
		m_collection = value;
	}